

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_grouping.cpp
# Opt level: O1

Grouper icu_63::number::impl::Grouper::forProperties(DecimalFormatProperties *properties)

{
  uint uVar1;
  uint uVar2;
  Grouper GVar3;
  
  if (properties->groupingUsed == true) {
    uVar1 = properties->groupingSize;
    uVar2 = properties->secondaryGroupingSize;
    if ((short)properties->secondaryGroupingSize < 1) {
      uVar2 = uVar1;
    }
    if ((short)uVar1 < 1) {
      uVar1 = uVar2;
    }
    GVar3._0_8_ = (ulong)uVar1 & 0xffff |
                  (ulong)CONCAT24((short)properties->minimumGroupingDigits,uVar2 << 0x10);
    GVar3.fStrategy = UNUM_GROUPING_COUNT;
    return GVar3;
  }
  return (Grouper)ZEXT812(0xfffeffffffff);
}

Assistant:

Grouper Grouper::forProperties(const DecimalFormatProperties& properties) {
    if (!properties.groupingUsed) {
        return forStrategy(UNUM_GROUPING_OFF);
    }
    auto grouping1 = static_cast<int16_t>(properties.groupingSize);
    auto grouping2 = static_cast<int16_t>(properties.secondaryGroupingSize);
    auto minGrouping = static_cast<int16_t>(properties.minimumGroupingDigits);
    grouping1 = grouping1 > 0 ? grouping1 : grouping2 > 0 ? grouping2 : grouping1;
    grouping2 = grouping2 > 0 ? grouping2 : grouping1;
    return {grouping1, grouping2, minGrouping, UNUM_GROUPING_COUNT};
}